

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_msg.c
# Opt level: O3

void setup_pipe(void)

{
  int line;
  char *fmt;
  
  if (send_file1 == (FILE *)0x0) {
    send_file1 = open_tmp_file(&send_file1_name);
    if (send_file1 != (FILE *)0x0) {
      return;
    }
    fmt = "Unable to create temporary file for communication; may not have permissions to do so";
    line = 0x13d;
    send_file1 = (FILE *)0x0;
  }
  else if (send_file2 == (FILE *)0x0) {
    send_file2 = open_tmp_file(&send_file2_name);
    if (send_file2 != (FILE *)0x0) {
      return;
    }
    fmt = "Unable to create temporary file for communication; may not have permissions to do so";
    line = 0x146;
    send_file2 = (FILE *)0x0;
  }
  else {
    fmt = "Only one nesting of suite runs supported";
    line = 0x14d;
  }
  eprintf(fmt,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_msg.c"
          ,line);
}

Assistant:

static void setup_pipe(void)
{
    if(send_file1 == NULL)
    {
        send_file1 = open_tmp_file(&send_file1_name);
        if(send_file1 == NULL)
        {
            eprintf("Unable to create temporary file for communication; may not have permissions to do so", __FILE__, __LINE__ -3);
        }
        return;
    }
    if(send_file2 == NULL)
    {
        send_file2 = open_tmp_file(&send_file2_name);
        if(send_file2 == NULL)
        {
            eprintf("Unable to create temporary file for communication; may not have permissions to do so", __FILE__, __LINE__ -3);
        }
        return;
    }
    eprintf("Only one nesting of suite runs supported", __FILE__, __LINE__);
}